

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_PrintMulti(Dtt_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  int Counts [13] [15];
  
  piVar10 = Counts[0];
  memset(Counts,0,0x30c);
  uVar4 = 0;
  do {
    if (uVar4 == 0xd) {
      return;
    }
    uVar3 = 0;
    uVar2 = (ulong)(uint)p->nClasses;
    if (p->nClasses < 1) {
      uVar2 = uVar3;
    }
    iVar9 = 0;
    uVar11 = 0;
    for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      if (uVar4 == (uint)p->pNodes[uVar3]) {
        uVar1 = p->pTimes[uVar3];
        piVar7 = Counts[uVar4];
        if (1 < uVar1) {
          uVar6 = 0;
          piVar5 = piVar10;
          for (uVar8 = uVar1 - 1; uVar8 != 0; uVar8 = uVar8 >> 1) {
            uVar6 = uVar6 + 1;
            piVar5 = piVar5 + 1;
          }
          if (0xe < uVar6) {
            __assert_fail("Log < 15",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                          ,0x298,"void Dtt_PrintMulti(Dtt_Man_t *)");
          }
          if (1 < (int)uVar1) {
            piVar7 = piVar5;
          }
        }
        *piVar7 = *piVar7 + 1;
        iVar9 = iVar9 + uVar1;
        uVar11 = uVar11 + 1;
      }
    }
    if (uVar11 == 0) {
      return;
    }
    printf("n=%2d : ",uVar4 & 0xffffffff);
    printf("All = %7d  ",(ulong)uVar11);
    printf("Ave = %6.2f  ",(double)iVar9 / (double)(int)uVar11);
    for (lVar12 = 0; lVar12 != 0xf; lVar12 = lVar12 + 1) {
      if (piVar10[lVar12] == 0) {
        printf("%6s","");
      }
      else {
        printf("%6d");
      }
    }
    putchar(10);
    uVar4 = uVar4 + 1;
    piVar10 = piVar10 + 0xf;
  } while( true );
}

Assistant:

void Dtt_PrintMulti( Dtt_Man_t * p )
{
    int n, Counts[13][15] = {{0}};
    for ( n = 0; n < 13; n++ )
    {
        int i, Total = 0, Count = 0;
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
            {
                int Log = Abc_Base2Log(p->pTimes[i]);
                assert( Log < 15 );
                if ( p->pTimes[i] < 2 )
                    Counts[n][0]++;
                else
                    Counts[n][Log]++;
                Total += p->pTimes[i];
                Count++;
            }
        if ( Count == 0 )
            break;
        printf( "n=%2d : ", n );
        printf( "All = %7d  ", Count );
        printf( "Ave = %6.2f  ", 1.0*Total/Count );
        for ( i = 0; i < 15; i++ )
            if ( Counts[n][i] )
                printf( "%6d", Counts[n][i] );
            else
                printf( "%6s", "" );
        printf( "\n" );
    }
}